

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrTsim3.c
# Opt level: O3

void Txs3_ManCollectCone(Txs3_Man_t *p,int fVerbose)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  int *piVar3;
  Gia_Man_t *pGVar4;
  Vec_Int_t *pVVar5;
  Vec_Int_t *pVVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  
  pVVar6 = p->vCiObjs;
  pVVar6->nSize = 0;
  p->vFosPre->nSize = 0;
  p->vFosAbs->nSize = 0;
  p->vNodes->nSize = 0;
  p->pGia->pObjs->Value = 0xffffffff;
  pVVar5 = p->vCoObjs;
  if (0 < pVVar5->nSize) {
    lVar12 = 0;
    do {
      iVar7 = pVVar5->pArray[lVar12];
      if (((long)iVar7 < 0) || (p->pGia->nObjs <= iVar7)) goto LAB_005fe795;
      pGVar2 = p->pGia->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      pGVar2 = pGVar2 + iVar7;
      Txs3_ManCollectCone_rec(p,pGVar2 + -(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff));
      lVar12 = lVar12 + 1;
      pVVar5 = p->vCoObjs;
    } while (lVar12 < pVVar5->nSize);
    pVVar6 = p->vCiObjs;
  }
  if (fVerbose != 0) {
    printf("%d %d %d \n",(ulong)(uint)pVVar6->nSize,(ulong)(uint)p->vFosPre->nSize,
           (ulong)(uint)p->vFosAbs->nSize);
    pVVar6 = p->vCiObjs;
  }
  iVar7 = pVVar6->nSize;
  p->nPiLits = iVar7;
  if (1 < (long)iVar7) {
    piVar3 = pVVar6->pArray;
    lVar12 = 1;
    uVar8 = 0;
    do {
      uVar11 = uVar8 & 0xffffffff;
      lVar9 = lVar12;
      do {
        uVar10 = (uint)lVar9;
        if (piVar3[(int)(uint)uVar11] <= piVar3[lVar9]) {
          uVar10 = (uint)uVar11;
        }
        lVar9 = lVar9 + 1;
        uVar11 = (ulong)uVar10;
      } while (iVar7 != lVar9);
      iVar1 = piVar3[uVar8];
      piVar3[uVar8] = piVar3[(int)uVar10];
      uVar8 = uVar8 + 1;
      piVar3[(int)uVar10] = iVar1;
      lVar12 = lVar12 + 1;
    } while (uVar8 != iVar7 - 1);
  }
  pVVar6 = p->vFosPre;
  iVar7 = pVVar6->nSize;
  if (1 < (long)iVar7) {
    piVar3 = pVVar6->pArray;
    lVar12 = 1;
    uVar8 = 0;
    do {
      uVar11 = uVar8 & 0xffffffff;
      lVar9 = lVar12;
      do {
        uVar10 = (uint)lVar9;
        if (piVar3[lVar9] <= piVar3[(int)(uint)uVar11]) {
          uVar10 = (uint)uVar11;
        }
        lVar9 = lVar9 + 1;
        uVar11 = (ulong)uVar10;
      } while (iVar7 != lVar9);
      iVar1 = piVar3[uVar8];
      piVar3[uVar8] = piVar3[(int)uVar10];
      uVar8 = uVar8 + 1;
      piVar3[(int)uVar10] = iVar1;
      lVar12 = lVar12 + 1;
    } while (uVar8 != iVar7 - 1);
    iVar7 = pVVar6->nSize;
  }
  if (0 < iVar7) {
    lVar12 = 0;
    do {
      Vec_IntPush(p->vCiObjs,pVVar6->pArray[lVar12]);
      lVar12 = lVar12 + 1;
      pVVar6 = p->vFosPre;
    } while (lVar12 < pVVar6->nSize);
  }
  pVVar6 = p->vFosAbs;
  iVar7 = pVVar6->nSize;
  if (1 < (long)iVar7) {
    piVar3 = pVVar6->pArray;
    lVar12 = 1;
    uVar8 = 0;
    do {
      uVar11 = uVar8 & 0xffffffff;
      lVar9 = lVar12;
      do {
        uVar10 = (uint)lVar9;
        if (piVar3[lVar9] <= piVar3[(int)(uint)uVar11]) {
          uVar10 = (uint)uVar11;
        }
        lVar9 = lVar9 + 1;
        uVar11 = (ulong)uVar10;
      } while (iVar7 != lVar9);
      iVar1 = piVar3[uVar8];
      piVar3[uVar8] = piVar3[(int)uVar10];
      uVar8 = uVar8 + 1;
      piVar3[(int)uVar10] = iVar1;
      lVar12 = lVar12 + 1;
    } while (uVar8 != iVar7 - 1);
    iVar7 = pVVar6->nSize;
  }
  if (0 < iVar7) {
    lVar12 = 0;
    do {
      Vec_IntPush(p->vCiObjs,pVVar6->pArray[lVar12]);
      lVar12 = lVar12 + 1;
      pVVar6 = p->vFosAbs;
    } while (lVar12 < pVVar6->nSize);
  }
  lVar12 = (long)p->vCiObjs->nSize;
  if (0 < lVar12) {
    pGVar4 = p->pGia;
    piVar3 = p->vCiObjs->pArray;
    lVar9 = 0;
    do {
      iVar7 = piVar3[lVar9];
      if (((long)iVar7 < 0) || (pGVar4->nObjs <= iVar7)) goto LAB_005fe795;
      pGVar2 = pGVar4->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      pGVar2[iVar7].Value = 0;
      lVar9 = lVar9 + 1;
    } while (lVar12 != lVar9);
  }
  lVar12 = (long)p->vNodes->nSize;
  if (0 < lVar12) {
    pGVar4 = p->pGia;
    piVar3 = p->vNodes->pArray;
    lVar9 = 0;
    do {
      iVar7 = piVar3[lVar9];
      if (((long)iVar7 < 0) || (pGVar4->nObjs <= iVar7)) {
LAB_005fe795:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar2 = pGVar4->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) {
        return;
      }
      pGVar2[iVar7].Value = 0;
      lVar9 = lVar9 + 1;
    } while (lVar12 != lVar9);
  }
  return;
}

Assistant:

void Txs3_ManCollectCone( Txs3_Man_t * p, int fVerbose )
{
    Gia_Obj_t * pObj; int i, Entry;
//    printf( "Collecting cones for clause with %d literals.\n", Vec_IntSize(vCoObjs) );
    Vec_IntClear( p->vCiObjs );
    Vec_IntClear( p->vFosPre );
    Vec_IntClear( p->vFosAbs );
    Vec_IntClear( p->vNodes );
    Gia_ManConst0(p->pGia)->Value = ~0;
    Gia_ManForEachObjVec( p->vCoObjs, p->pGia, pObj, i )
        Txs3_ManCollectCone_rec( p, Gia_ObjFanin0(pObj) );
if ( fVerbose )
printf( "%d %d %d \n", Vec_IntSize(p->vCiObjs), Vec_IntSize(p->vFosPre), Vec_IntSize(p->vFosAbs) );
    p->nPiLits = Vec_IntSize(p->vCiObjs);
    // sort primary inputs
    Vec_IntSelectSort( Vec_IntArray(p->vCiObjs), Vec_IntSize(p->vCiObjs) );
    // sort and add present flop variables
    Vec_IntSelectSortReverse( Vec_IntArray(p->vFosPre), Vec_IntSize(p->vFosPre) );
    Vec_IntForEachEntry( p->vFosPre, Entry, i )
        Vec_IntPush( p->vCiObjs, Entry );
    // sort and add absent flop variables
    Vec_IntSelectSortReverse( Vec_IntArray(p->vFosAbs), Vec_IntSize(p->vFosAbs) );
    Vec_IntForEachEntry( p->vFosAbs, Entry, i )
        Vec_IntPush( p->vCiObjs, Entry );
    // cleanup
    Gia_ManForEachObjVec( p->vCiObjs, p->pGia, pObj, i )
        pObj->Value = 0;
    Gia_ManForEachObjVec( p->vNodes, p->pGia, pObj, i )
        pObj->Value = 0;
}